

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseConstVector(JSONParser *this,ValueTypes *out_types,Values *out_values)

{
  pointer *ppVVar1;
  pointer pVVar2;
  iterator __position;
  iterator __position_00;
  undefined8 uVar3;
  bool bVar4;
  Result RVar5;
  Enum EVar6;
  TypedValue tv;
  ExpectedValue expected;
  TypedValue local_78;
  ExpectedValue local_60;
  
  pVVar2 = (out_values->
           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  RVar5 = Expect(this,"[");
  EVar6 = Error;
  if (RVar5.enum_ != Error) {
    bVar4 = Match(this,"]");
    if (bVar4) {
LAB_0016d64e:
      EVar6 = Ok;
    }
    else {
      do {
        RVar5 = ParseExpectedValue(this,&local_60,No);
        if (RVar5.enum_ == Error) {
          return (Result)Error;
        }
        local_78.value._8_8_ = local_60.value.value._8_8_;
        local_78.type.enum_ = local_60.value.type.enum_;
        local_78._4_4_ = local_60.value._4_4_;
        uVar3 = local_78._0_8_;
        local_78.value.i64_ = local_60.value.value.i64_;
        __position._M_current =
             (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)out_types,__position,
                     &local_78.type);
        }
        else {
          local_78.type.enum_ = local_60.value.type.enum_;
          (__position._M_current)->enum_ = local_78.type.enum_;
          (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
          local_78._0_8_ = uVar3;
        }
        __position_00._M_current =
             (out_values->
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (out_values->
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
          _M_realloc_insert<wabt::interp::Value_const&>
                    ((vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)out_values,
                     __position_00,&local_78.value);
        }
        else {
          *(u64 *)__position_00._M_current = local_78.value.i64_;
          *(undefined8 *)((long)__position_00._M_current + 8) = local_78.value._8_8_;
          ppVVar1 = &(out_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        bVar4 = Match(this,"]");
        if (bVar4) goto LAB_0016d64e;
        RVar5 = Expect(this,",");
      } while (RVar5.enum_ != Error);
    }
  }
  return (Result)EVar6;
}

Assistant:

wabt::Result JSONParser::ParseConstVector(ValueTypes* out_types, Values* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    TypedValue tv;
    CHECK_RESULT(ParseConst(&tv));
    out_types->push_back(tv.type);
    out_values->push_back(tv.value);
    first = false;
  }
  return wabt::Result::Ok;
}